

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O3

Vec_Int_t * Bmc_ManBCoreCollect(Gia_Man_t *p,int iFrame,int iOut,sat_solver *pSat)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  sat_solver *psVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *p_00;
  int *piVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  uint uVar16;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  Vec_Int_t *local_88;
  Vec_Int_t *local_80;
  Vec_Int_t *local_78;
  ulong local_70;
  int local_64;
  sat_solver *local_60;
  Vec_Int_t *local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  Gia_Man_t *local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar10 = (int *)malloc(400);
  p_00->pArray = piVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar11->pArray = piVar10;
  local_80 = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar11->pArray = piVar10;
  local_8c = iFrame;
  local_78 = pVVar11;
  if ((iOut | iFrame) < 0) {
    __assert_fail("iFrame >= 0 && iOut >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                  ,0x7c,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
  }
  Vec_IntPush(p_00,-1);
  Vec_IntPush(p_00,-1);
  iVar7 = p->vCos->nSize;
  if (iVar7 - p->nRegs <= iOut) {
LAB_0056862e:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((iOut < 0) || (iVar7 <= iOut)) {
LAB_0056847c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  local_40 = (ulong)(uint)iOut;
  iVar7 = p->vCos->pArray[local_40];
  if ((-1 < (long)iVar7) && (iVar7 < p->nObjs)) {
    local_64 = iOut;
    if (p_00->nSize < 0) {
LAB_00568574:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    p->pObjs[iVar7].Value = (uint)p_00->nSize >> 1;
    Vec_IntPush(p_00,iVar7);
    Vec_IntPush(p_00,local_8c);
    pVVar14 = local_78;
    pVVar11 = local_80;
    iVar7 = p->vCos->nSize;
    if (iVar7 - p->nRegs <= local_64) goto LAB_0056862e;
    if (iVar7 <= local_64) goto LAB_0056847c;
    iVar7 = p->vCos->pArray[local_40];
    if ((-1 < iVar7) && (iVar7 < p->nObjs)) {
      Vec_IntPush(local_80,iVar7);
      local_88 = pVVar11;
      uVar12 = (ulong)local_8c;
      local_60 = pSat;
      local_58 = p_00;
      local_38 = p;
      if (-1 < (int)local_8c) {
        do {
          local_70 = uVar12;
          local_88 = pVVar14;
          Gia_ManIncrementTravId(p);
          if (p->nObjs < 1) {
LAB_00568555:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (p->nTravIdsAlloc < 1) {
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
          }
          pGVar4 = p->pObjs;
          *p->pTravIds = p->nTravIds;
          if (p_00->nSize < 0) goto LAB_00568574;
          pGVar4->Value = (uint)p_00->nSize >> 1;
          if (p->nObjs < 1) goto LAB_00568555;
          Vec_IntPush(p_00,0);
          Vec_IntPush(p_00,(int)local_70);
          uVar15 = p->pObjs->Value;
          if ((int)uVar15 < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x15f,"int sat_solver_add_const(sat_solver *, int, int)");
          }
          local_98 = uVar15 * 2 + 1;
          iVar7 = sat_solver_addclause(pSat,(lit *)&local_98,(lit *)&local_94);
          pVVar14 = local_80;
          pVVar11 = local_88;
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x163,"int sat_solver_add_const(sat_solver *, int, int)");
          }
          local_88->nSize = 0;
          local_78 = (Vec_Int_t *)(ulong)(uint)p_00->nSize;
          uVar12 = (ulong)(uint)local_80->nSize;
          if (local_80->nSize < 1) {
            if ((uint)local_70 == local_8c) goto LAB_00567f47;
          }
          else {
            lVar13 = 0;
            do {
              iVar8 = (int)uVar12;
              iVar7 = pVVar14->pArray[lVar13];
              if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0056845d;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              Bmc_ManBCoreCollect_rec
                        (p,iVar7 - (*(uint *)(p->pObjs + iVar7) & 0x1fffffff),(int)local_70,p_00,
                         pVVar11);
              lVar13 = lVar13 + 1;
              iVar8 = pVVar14->nSize;
              uVar12 = (ulong)iVar8;
            } while (lVar13 < (long)uVar12);
            if ((uint)local_70 == local_8c) {
LAB_00567f47:
              psVar6 = local_60;
              iVar7 = p->vCos->nSize;
              if (iVar7 - p->nRegs <= local_64) goto LAB_0056862e;
              if (iVar7 <= local_64) goto LAB_0056847c;
              iVar7 = p->vCos->pArray[local_40];
              lVar13 = (long)iVar7;
              if ((lVar13 < 0) || (p->nObjs <= iVar7)) goto LAB_0056845d;
              if (p->pObjs[lVar13].Value != 1) {
                __assert_fail("pObj->Value == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                              ,0x94,
                              "Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)")
                ;
              }
              pGVar4 = p->pObjs + lVar13;
              uVar15 = (uint)*(undefined8 *)pGVar4;
              if (pGVar4[-(ulong)(uVar15 & 0x1fffffff)].Value != 3) {
                __assert_fail("Gia_ObjFanin0(pObj)->Value == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                              ,0x95,
                              "Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)")
                ;
              }
              uVar15 = uVar15 >> 0x1d | 6;
              local_94 = 2;
              local_98 = uVar15;
              iVar7 = sat_solver_addclause(local_60,(lit *)&local_98,(lit *)&local_90);
              if (iVar7 == 0) goto LAB_005685f0;
              local_94 = 3;
              local_98 = uVar15;
              iVar7 = sat_solver_addclause(psVar6,(lit *)&local_98,(lit *)&local_90);
              if (iVar7 == 0) goto LAB_0056860f;
            }
            else if (0 < iVar8) {
              lVar13 = 0;
              do {
                psVar6 = local_60;
                iVar7 = local_80->pArray[lVar13];
                if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0056845d;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                pGVar4 = p->pObjs + iVar7;
                if ((int)(pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value |
                         pGVar4->Value) < 0) {
                  __assert_fail("iVarA >= 0 && iVarB >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
                }
                uVar9 = pGVar4->Value * 2;
                uVar15 = ((uint)*(undefined8 *)pGVar4 >> 0x1d & 1) +
                         pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value * 2;
                local_94 = uVar15 ^ 1;
                local_98 = uVar9;
                iVar7 = sat_solver_addclause(local_60,(lit *)&local_98,(lit *)&local_90);
                if (iVar7 != 0) {
                  local_98 = uVar9 | 1;
                  local_94 = uVar15;
                  sat_solver_addclause(psVar6,(lit *)&local_98,(lit *)&local_90);
                }
                lVar13 = lVar13 + 1;
                p_00 = local_58;
              } while (lVar13 < local_80->nSize);
            }
          }
          pSat = local_60;
          iVar7 = local_88->nSize;
          if (0 < (long)iVar7) {
            piVar10 = local_88->pArray;
            lVar13 = 0;
            do {
              iVar8 = piVar10[lVar13];
              if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0056845d;
              pGVar4 = p->pObjs;
              if (pGVar4 == (Gia_Obj_t *)0x0) break;
              uVar5 = *(undefined8 *)(pGVar4 + iVar8);
              uVar15 = (uint)uVar5;
              if ((-1 < (int)uVar15) || ((uVar15 & 0x1fffffff) == 0x1fffffff)) goto LAB_0056849b;
              uVar15 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
              iVar1 = p->vCos->nSize;
              if ((int)uVar15 < iVar1 - p->nRegs) goto LAB_0056849b;
              iVar2 = p->vCis->nSize;
              uVar15 = (iVar2 - iVar1) + uVar15;
              if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_0056847c;
              uVar15 = p->vCis->pArray[uVar15];
              if (((long)(int)uVar15 < 0) || ((uint)p->nObjs <= uVar15)) goto LAB_0056845d;
              pGVar4[iVar8].Value = pGVar4[(int)uVar15].Value;
              lVar13 = lVar13 + 1;
            } while (iVar7 != lVar13);
          }
          iVar7 = p_00->nSize;
          pVVar11 = local_78;
          pVVar14 = local_78;
          iVar8 = iVar7;
          if ((int)local_78 < iVar7) {
            do {
              local_44 = iVar8;
              if ((int)pVVar14 < 0) goto LAB_0056847c;
              lVar13 = (long)p_00->pArray[(long)pVVar11];
              if ((lVar13 < 0) || (p->nObjs <= p_00->pArray[(long)pVVar11])) goto LAB_0056845d;
              pGVar4 = p->pObjs;
              uVar12 = *(ulong *)(pGVar4 + lVar13);
              uVar15 = (uint)uVar12;
              if ((~uVar15 & 0x9fffffff) != 0) {
                if (((int)uVar15 < 0) || ((uVar15 & 0x1fffffff) == 0x1fffffff)) {
                  __assert_fail("Gia_ObjIsAnd(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                                ,0xa7,
                                "Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)"
                               );
                }
                uVar3 = pGVar4[lVar13].Value;
                uVar16 = (uint)(uVar12 >> 0x20);
                local_50 = (ulong)pGVar4[lVar13 - (ulong)(uVar16 & 0x1fffffff)].Value;
                uVar9 = uVar3 * 2 + 1;
                uVar15 = ((uint)(uVar12 >> 0x1d) & 1) +
                         pGVar4[lVar13 - (ulong)(uVar15 & 0x1fffffff)].Value * 2;
                local_98 = uVar9;
                local_94 = uVar15;
                iVar7 = sat_solver_addclause(pSat,(lit *)&local_98,(lit *)&local_90);
                if (iVar7 == 0) {
                  __assert_fail("Cid",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x196,
                                "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)"
                               );
                }
                uVar16 = (uVar16 >> 0x1d & 1) + (int)local_50 * 2;
                local_98 = uVar9;
                local_94 = uVar16;
                iVar7 = sat_solver_addclause(pSat,(lit *)&local_98,(lit *)&local_90);
                if (iVar7 == 0) {
                  __assert_fail("Cid",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x19b,
                                "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)"
                               );
                }
                local_98 = uVar3 * 2;
                local_94 = uVar15 ^ 1;
                local_90 = uVar16 ^ 1;
                iVar8 = sat_solver_addclause(pSat,(lit *)&local_98,(lit *)&local_8c);
                pVVar14 = local_78;
                p = local_38;
                p_00 = local_58;
                iVar7 = local_44;
                if (iVar8 == 0) {
                  __assert_fail("Cid",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x1a1,
                                "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)"
                               );
                }
              }
              pVVar11 = (Vec_Int_t *)((long)&pVVar11->nCap + 2);
              iVar8 = local_44;
            } while ((int)pVVar11 < iVar7);
          }
          pVVar14 = local_80;
          iVar7 = (int)local_70;
          local_70 = (ulong)(iVar7 - 1);
          local_80 = local_88;
          uVar12 = local_70;
        } while (0 < iVar7);
      }
      local_78 = pVVar14;
      if (0 < local_88->nSize) {
        uVar12 = 0;
        do {
          psVar6 = local_60;
          iVar7 = local_88->pArray[uVar12];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0056845d;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar15 = p_00->nSize;
          if ((int)uVar15 < 0) goto LAB_00568574;
          pGVar4 = p->pObjs + iVar7;
          uVar9 = pGVar4->Value;
          local_50 = uVar12;
          if ((int)uVar9 < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x25c,"int sat_solver_add_constraint(sat_solver *, int, int, int)");
          }
          uVar9 = uVar9 * 2 + 1;
          local_94 = uVar15 & 0x7ffffffe;
          local_98 = uVar9;
          iVar7 = sat_solver_addclause(local_60,(lit *)&local_98,(lit *)&local_90);
          if (iVar7 == 0) {
LAB_005685f0:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x261,"int sat_solver_add_constraint(sat_solver *, int, int, int)");
          }
          local_94 = uVar15 | 1;
          local_98 = uVar9;
          iVar7 = sat_solver_addclause(psVar6,(lit *)&local_98,(lit *)&local_90);
          p = local_38;
          p_00 = local_58;
          if (iVar7 == 0) {
LAB_0056860f:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x266,"int sat_solver_add_constraint(sat_solver *, int, int, int)");
          }
          uVar5 = *(undefined8 *)pGVar4;
          uVar9 = (uint)uVar5;
          if ((-1 < (int)uVar9) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
LAB_0056849b:
            __assert_fail("Gia_ObjIsRi(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
          iVar7 = local_38->vCos->nSize;
          if ((int)uVar9 < iVar7 - local_38->nRegs) goto LAB_0056849b;
          iVar8 = local_38->vCis->nSize;
          uVar9 = (iVar8 - iVar7) + uVar9;
          if (((int)uVar9 < 0) || (iVar8 <= (int)uVar9)) goto LAB_0056847c;
          iVar7 = local_38->vCis->pArray[uVar9];
          if (((long)iVar7 < 0) || (local_38->nObjs <= iVar7)) goto LAB_0056845d;
          local_38->pObjs[iVar7].Value = uVar15 >> 1;
          Vec_IntPush(local_58,iVar7);
          Vec_IntPush(p_00,-1);
          uVar12 = local_50 + 1;
        } while ((long)uVar12 < (long)local_88->nSize);
      }
      pVVar11 = local_88;
      if (local_88->pArray != (int *)0x0) {
        free(local_88->pArray);
      }
      free(pVVar11);
      pVVar11 = local_78;
      if (local_78->pArray != (int *)0x0) {
        free(local_78->pArray);
      }
      free(pVVar11);
      return p_00;
    }
  }
LAB_0056845d:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollect( Gia_Man_t * p, int iFrame, int iOut, sat_solver * pSat )
{
    Gia_Obj_t * pObj; 
    int f, i, iObj, nNodesOld;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots2 = Vec_IntAlloc( 100 );
    assert( iFrame >= 0 && iOut >= 0 );
    // add first variables
    Vec_IntPush( vNodes, -1 );
    Vec_IntPush( vNodes, -1 );
    Bmc_ManBCoreAssignVar( p, Gia_ManPo(p, iOut), iFrame, vNodes );
    // start with root node
    Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, iOut)) );
    // iterate through time frames
    for ( f = iFrame; f >= 0; f-- )
    {
        Gia_ManIncrementTravId( p );
        // add constant node
        Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
        Bmc_ManBCoreAssignVar( p, Gia_ManConst0(p), f, vNodes );
        sat_solver_add_const( pSat, Gia_ManConst0(p)->Value, 1 );
        // collect nodes in this timeframe
        Vec_IntClear( vRoots2 );
        nNodesOld = Vec_IntSize(vNodes);
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
            Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRoots2 );
        if ( f == iFrame )
        {
            // add the final clause
            pObj = Gia_ManPo(p, iOut);
            assert( pObj->Value == 1 );
            assert( Gia_ObjFanin0(pObj)->Value == 3 );
//            sat_solver_add_const( pSat, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            sat_solver_add_constraint( pSat, Gia_ObjFanin0(pObj)->Value, pObj->Value, Gia_ObjFaninC0(pObj) );
        }
        else
        {
            // connect current RIs to previous ROs
            Gia_ManForEachObjVec( vRoots, p, pObj, i )
                sat_solver_add_buffer( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        }
        Gia_ManForEachObjVec( vRoots2, p, pObj, i )
            pObj->Value = Gia_ObjRiToRo(p, pObj)->Value;
        // add nodes of this timeframe
        Vec_IntForEachEntryStart( vNodes, iObj, i, nNodesOld )
        {
            pObj = Gia_ManObj(p, iObj); i++;
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) );
            sat_solver_add_and( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 );
        }
        // collect constant node
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    // add constraint variables for the init state
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
    {
        sat_solver_add_constraint( pSat, pObj->Value, Abc_Lit2Var(Vec_IntSize(vNodes)), 1 );
        pObj = Gia_ObjRiToRo(p, pObj);
        Bmc_ManBCoreAssignVar( p, pObj, -1, vNodes );
    }
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    return vNodes;
}